

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O2

int Import(WebPPicture *picture,uint8_t *rgb,int rgb_stride,int step,int swap_rb,int import_alpha)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint8_t *a_ptr;
  int iVar5;
  int iVar6;
  uint32_t *dst;
  uint32_t *__dest;
  bool bVar7;
  
  iVar5 = -rgb_stride;
  if (0 < rgb_stride) {
    iVar5 = rgb_stride;
  }
  iVar1 = picture->width;
  iVar6 = 0;
  if ((int)((4 - (uint)(import_alpha == 0)) * iVar1) <= iVar5) {
    uVar2 = (uint)(swap_rb != 0) * 2;
    uVar3 = (uint)(swap_rb == 0) * 2;
    if (picture->use_argb == 0) {
      a_ptr = (uint8_t *)0x0;
      if (import_alpha != 0) {
        a_ptr = rgb + 3;
      }
      iVar6 = ImportYUVAFromRGBA(rgb + uVar2,rgb + 1,rgb + uVar3,a_ptr,step,rgb_stride,0.0,0,picture
                                );
    }
    else {
      iVar5 = picture->height;
      iVar4 = WebPPictureAlloc(picture);
      iVar6 = 0;
      if (iVar4 != 0) {
        VP8LDspInit();
        WebPInitAlphaProcessing();
        __dest = picture->argb;
        if (import_alpha == 0) {
          iVar6 = 0;
          if (0 < iVar5) {
            iVar6 = iVar5;
          }
          while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
            (*WebPPackRGB)(rgb + uVar2,rgb + 1,rgb + uVar3,iVar1,step,__dest);
            __dest = __dest + picture->argb_stride;
            rgb = rgb + rgb_stride;
          }
        }
        else if (swap_rb == 0) {
          iVar6 = 0;
          if (0 < iVar5) {
            iVar6 = iVar5;
          }
          while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
            (*VP8LConvertBGRAToRGBA)((uint32_t *)rgb,iVar1,(uint8_t *)__dest);
            rgb = (uint8_t *)((long)rgb + (long)rgb_stride);
            __dest = __dest + picture->argb_stride;
          }
        }
        else {
          iVar6 = 0;
          if (0 < iVar5) {
            iVar6 = iVar5;
          }
          while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
            memcpy(__dest,rgb,(long)iVar1 << 2);
            rgb = rgb + rgb_stride;
            __dest = __dest + picture->argb_stride;
          }
        }
        iVar6 = 1;
      }
    }
  }
  return iVar6;
}

Assistant:

static int Import(WebPPicture* const picture,
                  const uint8_t* rgb, int rgb_stride,
                  int step, int swap_rb, int import_alpha) {
  int y;
  // swap_rb -> b,g,r,a , !swap_rb -> r,g,b,a
  const uint8_t* r_ptr = rgb + (swap_rb ? 2 : 0);
  const uint8_t* g_ptr = rgb + 1;
  const uint8_t* b_ptr = rgb + (swap_rb ? 0 : 2);
  const int width = picture->width;
  const int height = picture->height;

  if (abs(rgb_stride) < (import_alpha ? 4 : 3) * width) return 0;

  if (!picture->use_argb) {
    const uint8_t* a_ptr = import_alpha ? rgb + 3 : NULL;
    return ImportYUVAFromRGBA(r_ptr, g_ptr, b_ptr, a_ptr, step, rgb_stride,
                              0.f /* no dithering */, 0, picture);
  }
  if (!WebPPictureAlloc(picture)) return 0;

  VP8LDspInit();
  WebPInitAlphaProcessing();

  if (import_alpha) {
    // dst[] byte order is {a,r,g,b} for big-endian, {b,g,r,a} for little endian
    uint32_t* dst = picture->argb;
    const int do_copy = (ALPHA_OFFSET == 3) && swap_rb;
    assert(step == 4);
    if (do_copy) {
      for (y = 0; y < height; ++y) {
        memcpy(dst, rgb, width * 4);
        rgb += rgb_stride;
        dst += picture->argb_stride;
      }
    } else {
      for (y = 0; y < height; ++y) {
#ifdef WORDS_BIGENDIAN
        // BGRA or RGBA input order.
        const uint8_t* a_ptr = rgb + 3;
        WebPPackARGB(a_ptr, r_ptr, g_ptr, b_ptr, width, dst);
        r_ptr += rgb_stride;
        g_ptr += rgb_stride;
        b_ptr += rgb_stride;
#else
        // RGBA input order. Need to swap R and B.
        VP8LConvertBGRAToRGBA((const uint32_t*)rgb, width, (uint8_t*)dst);
#endif
        rgb += rgb_stride;
        dst += picture->argb_stride;
      }
    }
  } else {
    uint32_t* dst = picture->argb;
    assert(step >= 3);
    for (y = 0; y < height; ++y) {
      WebPPackRGB(r_ptr, g_ptr, b_ptr, width, step, dst);
      r_ptr += rgb_stride;
      g_ptr += rgb_stride;
      b_ptr += rgb_stride;
      dst += picture->argb_stride;
    }
  }
  return 1;
}